

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AeronArchive.cpp
# Opt level: O1

void __thiscall
aeron::archive::AeronArchive::AeronArchive
          (AeronArchive *this,Context *ctx,ArchiveProxy *archiveProxy)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  ArchiveProxy *pAVar2;
  
  Context::Context(&this->ctx_,ctx);
  pAVar2 = (ArchiveProxy *)operator_new(0x1040);
  (pAVar2->publication_).super___shared_ptr<aeron::ExclusivePublication,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (archiveProxy->publication_).
            super___shared_ptr<aeron::ExclusivePublication,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var1 = (archiveProxy->publication_).
           super___shared_ptr<aeron::ExclusivePublication,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
  ((long)&(pAVar2->publication_).
          super___shared_ptr<aeron::ExclusivePublication,_(__gnu_cxx::_Lock_policy)2> + 8))->_M_pi =
       p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  memcpy(&pAVar2->underlyingBuffer_,&archiveProxy->underlyingBuffer_,0x1000);
  (pAVar2->buffer_)._vptr_AtomicBuffer = (_func_int **)&PTR__AtomicBuffer_00162160;
  (pAVar2->buffer_).m_buffer = (archiveProxy->buffer_).m_buffer;
  (pAVar2->buffer_).m_length = (archiveProxy->buffer_).m_length;
  (pAVar2->connectTimeoutNs_).__r = (archiveProxy->connectTimeoutNs_).__r;
  pAVar2->retryAttempts_ = archiveProxy->retryAttempts_;
  (this->archiveProxy_)._M_t.
  super___uniq_ptr_impl<aeron::archive::ArchiveProxy,_std::default_delete<aeron::archive::ArchiveProxy>_>
  ._M_t.
  super__Tuple_impl<0UL,_aeron::archive::ArchiveProxy_*,_std::default_delete<aeron::archive::ArchiveProxy>_>
  .super__Head_base<0UL,_aeron::archive::ArchiveProxy_*,_false>._M_head_impl = pAVar2;
  *(undefined8 *)((long)&(this->lock_).super___mutex_base._M_mutex + 0x10) = 0;
  (this->lock_).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->lock_).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->lock_).super___mutex_base._M_mutex + 8) = 0;
  (this->lock_).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  (this->aeron_).super___shared_ptr<aeron::Aeron,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->aeron_).super___shared_ptr<aeron::Aeron,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->controlResponsePoller_)._M_t.
  super___uniq_ptr_impl<aeron::archive::ControlResponsePoller,_std::default_delete<aeron::archive::ControlResponsePoller>_>
  ._M_t.
  super__Tuple_impl<0UL,_aeron::archive::ControlResponsePoller_*,_std::default_delete<aeron::archive::ControlResponsePoller>_>
  .super__Head_base<0UL,_aeron::archive::ControlResponsePoller_*,_false>._M_head_impl =
       (ControlResponsePoller *)0x0;
  (this->recordingDescriptorPoller_)._M_t.
  super___uniq_ptr_impl<aeron::archive::RecordingDescriptorPoller,_std::default_delete<aeron::archive::RecordingDescriptorPoller>_>
  ._M_t.
  super__Tuple_impl<0UL,_aeron::archive::RecordingDescriptorPoller_*,_std::default_delete<aeron::archive::RecordingDescriptorPoller>_>
  .super__Head_base<0UL,_aeron::archive::RecordingDescriptorPoller_*,_false>._M_head_impl =
       (RecordingDescriptorPoller *)0x0;
  return;
}

Assistant:

AeronArchive::AeronArchive(const Context& ctx, const ArchiveProxy& archiveProxy)
    : ctx_(ctx)
    , archiveProxy_(std::make_unique<ArchiveProxy>(archiveProxy)) {
    // TODO
}